

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

void Kit_TruthAndPhase(uint *pOut,uint *pIn0,uint *pIn1,int nVars,int fCompl0,int fCompl1)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (fCompl0 == 0) {
    for (; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      pOut[uVar1 - 1] = pIn1[uVar1 - 1] & pIn0[uVar1 - 1];
    }
  }
  else {
    for (; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      pOut[uVar1 - 1] = ~pIn1[uVar1 - 1] & pIn0[uVar1 - 1];
    }
  }
  return;
}

Assistant:

static inline void Kit_TruthAndPhase( unsigned * pOut, unsigned * pIn0, unsigned * pIn1, int nVars, int fCompl0, int fCompl1 )
{
    int w;
    if ( fCompl0 && fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = ~(pIn0[w] | pIn1[w]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = ~pIn0[w] & pIn1[w];
    }
    else if ( !fCompl0 && fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = pIn0[w] & ~pIn1[w];
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = pIn0[w] & pIn1[w];
    }
}